

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O1

void __thiscall
HighsLinearSumBounds::updatedVarUpper
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient,
          double oldVarUpper)

{
  double *pdVar1;
  int *piVar2;
  pointer pHVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar7 = oldVarUpper;
  if ((this->implVarUpperSource[var] != sum) && (this->implVarUpper[var] <= oldVarUpper)) {
    dVar7 = this->implVarUpper[var];
  }
  if (this->implVarUpperSource[var] == sum) {
    pdVar4 = this->varUpper + var;
  }
  else {
    pdVar1 = this->varUpper + var;
    dVar5 = this->implVarUpper[var];
    pdVar4 = this->implVarUpper + var;
    if (*pdVar1 <= dVar5 && dVar5 != *pdVar1) {
      pdVar4 = pdVar1;
    }
  }
  dVar5 = *pdVar4;
  if (0.0 < coefficient) {
    if ((dVar5 != dVar7) || (NAN(dVar5) || NAN(dVar7))) {
      if (dVar7 < INFINITY) {
        dVar7 = dVar7 * coefficient;
        pHVar3 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar6 = pHVar3[sum].hi;
        dVar8 = dVar6 - dVar7;
        pHVar3[sum].hi = dVar8;
        pHVar3[sum].lo =
             (dVar6 - (dVar7 + dVar8)) + (-dVar7 - (dVar8 - (dVar7 + dVar8))) + pHVar3[sum].lo;
      }
      else {
        piVar2 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar2 = *piVar2 + -1;
      }
      if (dVar5 < INFINITY) {
        dVar5 = dVar5 * coefficient;
        pHVar3 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar7 = pHVar3[sum].hi;
        dVar6 = dVar5 + dVar7;
        pHVar3[sum].hi = dVar6;
        pHVar3[sum].lo =
             (dVar7 - (dVar6 - dVar5)) + (dVar5 - (dVar6 - (dVar6 - dVar5))) + pHVar3[sum].lo;
      }
      else {
        piVar2 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar2 = *piVar2 + 1;
      }
    }
    if (oldVarUpper < INFINITY) {
      dVar5 = oldVarUpper * coefficient;
      pHVar3 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar7 = pHVar3[sum].hi;
      dVar6 = dVar7 - dVar5;
      pHVar3[sum].hi = dVar6;
      pHVar3[sum].lo =
           (dVar7 - (dVar5 + dVar6)) + (-dVar5 - (dVar6 - (dVar5 + dVar6))) + pHVar3[sum].lo;
    }
    else {
      piVar2 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar2 = *piVar2 + -1;
    }
    if (INFINITY <= this->varUpper[var]) {
      piVar2 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar2 = *piVar2 + 1;
      return;
    }
    dVar5 = this->varUpper[var] * coefficient;
    pHVar3 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar7 = pHVar3[sum].hi;
    dVar6 = dVar5 + dVar7;
    pHVar3[sum].hi = dVar6;
    pHVar3[sum].lo =
         (dVar7 - (dVar6 - dVar5)) + (dVar5 - (dVar6 - (dVar6 - dVar5))) + pHVar3[sum].lo;
    return;
  }
  if ((dVar5 != dVar7) || (NAN(dVar5) || NAN(dVar7))) {
    if (dVar7 < INFINITY) {
      dVar7 = dVar7 * coefficient;
      pHVar3 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar6 = pHVar3[sum].hi;
      dVar8 = dVar6 - dVar7;
      pHVar3[sum].hi = dVar8;
      pHVar3[sum].lo =
           (dVar6 - (dVar7 + dVar8)) + (-dVar7 - (dVar8 - (dVar7 + dVar8))) + pHVar3[sum].lo;
    }
    else {
      piVar2 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar2 = *piVar2 + -1;
    }
    if (dVar5 < INFINITY) {
      dVar5 = dVar5 * coefficient;
      pHVar3 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar7 = pHVar3[sum].hi;
      dVar6 = dVar5 + dVar7;
      pHVar3[sum].hi = dVar6;
      pHVar3[sum].lo =
           (dVar7 - (dVar6 - dVar5)) + (dVar5 - (dVar6 - (dVar6 - dVar5))) + pHVar3[sum].lo;
    }
    else {
      piVar2 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar2 = *piVar2 + 1;
    }
  }
  if (oldVarUpper < INFINITY) {
    dVar5 = oldVarUpper * coefficient;
    pHVar3 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar7 = pHVar3[sum].hi;
    dVar6 = dVar7 - dVar5;
    pHVar3[sum].hi = dVar6;
    pHVar3[sum].lo =
         (dVar7 - (dVar5 + dVar6)) + (-dVar5 - (dVar6 - (dVar5 + dVar6))) + pHVar3[sum].lo;
  }
  else {
    piVar2 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + sum;
    *piVar2 = *piVar2 + -1;
  }
  if (INFINITY <= this->varUpper[var]) {
    piVar2 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + sum;
    *piVar2 = *piVar2 + 1;
    return;
  }
  dVar5 = this->varUpper[var] * coefficient;
  pHVar3 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar7 = pHVar3[sum].hi;
  dVar6 = dVar5 + dVar7;
  pHVar3[sum].hi = dVar6;
  pHVar3[sum].lo = (dVar7 - (dVar6 - dVar5)) + (dVar5 - (dVar6 - (dVar6 - dVar5))) + pHVar3[sum].lo;
  return;
}

Assistant:

void HighsLinearSumBounds::updatedVarUpper(HighsInt sum, HighsInt var,
                                           double coefficient,
                                           double oldVarUpper) {
  double oldVUpper = implVarUpperSource[var] == sum
                         ? oldVarUpper
                         : std::min(implVarUpper[var], oldVarUpper);

  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (coefficient > 0) {
    if (vUpper != oldVUpper) {
      if (oldVUpper == kHighsInf)
        numInfSumUpper[sum] -= 1;
      else
        sumUpper[sum] -= oldVUpper * coefficient;

      if (vUpper == kHighsInf)
        numInfSumUpper[sum] += 1;
      else
        sumUpper[sum] += vUpper * coefficient;
    }
    if (oldVarUpper == kHighsInf)
      numInfSumUpperOrig[sum] -= 1;
    else
      sumUpperOrig[sum] -= oldVarUpper * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumUpperOrig[sum] += 1;
    else
      sumUpperOrig[sum] += varUpper[var] * coefficient;
  } else {
    if (vUpper != oldVUpper) {
      if (oldVUpper == kHighsInf)
        numInfSumLower[sum] -= 1;
      else
        sumLower[sum] -= oldVUpper * coefficient;

      if (vUpper == kHighsInf)
        numInfSumLower[sum] += 1;
      else
        sumLower[sum] += vUpper * coefficient;
    }
    if (oldVarUpper == kHighsInf)
      numInfSumLowerOrig[sum] -= 1;
    else
      sumLowerOrig[sum] -= oldVarUpper * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumLowerOrig[sum] += 1;
    else
      sumLowerOrig[sum] += varUpper[var] * coefficient;
  }
}